

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceNodeCloud.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChContactSurfaceNodeCloud::SurfaceAddCollisionModelsToSystem
          (ChContactSurfaceNodeCloud *this,ChSystem *msys)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (msys != (ChSystem *)0x0) {
    (*(this->super_ChContactSurface)._vptr_ChContactSurface[2])();
    if ((this->vnodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->vnodes).
        super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        peVar1 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var2 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (*peVar1->_vptr_ChCollisionSystem[4])
                  (peVar1,((this->vnodes).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].
                           super___shared_ptr<chrono::fea::ChContactNodeXYZsphere,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->collision_model);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        bVar3 = uVar5 < (ulong)((long)(this->vnodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->vnodes).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZsphere>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar3);
    }
    if ((this->vnodes_rot).
        super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->vnodes_rot).
        super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar4 = 0;
      uVar5 = 1;
      do {
        peVar1 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var2 = (msys->collision_system).
                 super___shared_ptr<chrono::collision::ChCollisionSystem,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (*peVar1->_vptr_ChCollisionSystem[4])
                  (peVar1,((this->vnodes_rot).
                           super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar4].
                           super___shared_ptr<chrono::fea::ChContactNodeXYZROTsphere,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->collision_model);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        bVar3 = uVar5 < (ulong)((long)(this->vnodes_rot).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->vnodes_rot).
                                      super__Vector_base<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>,_std::allocator<std::shared_ptr<chrono::fea::ChContactNodeXYZROTsphere>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar3);
    }
    return;
  }
  __assert_fail("msys",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChContactSurfaceNodeCloud.cpp"
                ,0xa2,
                "virtual void chrono::fea::ChContactSurfaceNodeCloud::SurfaceAddCollisionModelsToSystem(ChSystem *)"
               );
}

Assistant:

void ChContactSurfaceNodeCloud::SurfaceAddCollisionModelsToSystem(ChSystem* msys) {
    assert(msys);
    SurfaceSyncCollisionModels();
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        msys->GetCollisionSystem()->Add(this->vnodes[j]->GetCollisionModel());
    }
    for (unsigned int j = 0; j < vnodes_rot.size(); j++) {
        msys->GetCollisionSystem()->Add(this->vnodes_rot[j]->GetCollisionModel());
    }
}